

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O0

Bool prvTidyIsPushedLast(TidyDocImpl *doc,Node *element,Node *node)

{
  Lexer *pLVar1;
  Bool BVar2;
  Lexer *lexer;
  Node *node_local;
  Node *element_local;
  TidyDocImpl *doc_local;
  
  pLVar1 = doc->lexer;
  if ((element == (Node *)0x0) || (BVar2 = IsNodePushable(element), BVar2 != no)) {
    if ((pLVar1->istacksize == 0) || (pLVar1->istack[pLVar1->istacksize - 1].tag != node->tag)) {
      doc_local._4_4_ = no;
    }
    else {
      doc_local._4_4_ = yes;
    }
  }
  else {
    doc_local._4_4_ = no;
  }
  return doc_local._4_4_;
}

Assistant:

Bool TY_(IsPushedLast)( TidyDocImpl* doc, Node *element, Node *node )
{
    Lexer* lexer = doc->lexer;

    if ( element && !IsNodePushable(element) )
        return no;

    if (lexer->istacksize > 0) {
        if (lexer->istack[lexer->istacksize - 1].tag == node->tag) {
            return yes;
        }
    }

    return no;
}